

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry *
NscBuildParameter(CNscPStackEntry *pType,CNscPStackEntry *pId,CNscPStackEntry *pInit)

{
  NscType nType_00;
  size_t sVar1;
  CNscPStackEntry *this;
  NscType nType;
  size_t sVar2;
  size_t *local_48;
  size_t local_38;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if (pType == (CNscPStackEntry *)0x0) {
    __assert_fail("pType",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x5f3,
                  "CNscPStackEntry *NscBuildParameter(CNscPStackEntry *, CNscPStackEntry *, CNscPStackEntry *)"
                 );
  }
  if (pId != (CNscPStackEntry *)0x0) {
    nType_00 = pType->m_nType;
    if (((nType_00 == NscType_Error) || (pId->m_nType == NscType_Error)) ||
       ((pInit != (CNscPStackEntry *)0x0 && (pInit->m_nType == NscType_Error)))) {
      CNscPStackEntry::SetType(this,NscType_Error);
    }
    else if ((g_pCtx->m_fPhase2 != false) || (g_pCtx->m_fNWScript == true)) {
      if ((pType->m_ulFlags & 0x80) != 0) {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConstIllegalOnParameter,pId->m_pszId);
      }
      if (pInit == (CNscPStackEntry *)0x0) {
        sVar2 = 0;
        local_48 = (size_t *)0x0;
      }
      else {
        local_38 = pInit->m_nDataSize;
        local_48 = (size_t *)pInit->m_pauchData;
        NscSimplifyConstant((uchar *)local_48,&local_38);
        sVar2 = local_38;
        sVar1 = *local_48;
        if ((sVar1 == local_38) && ((int)local_48[1] == 0x34)) {
          sVar2 = sVar1;
          if ((g_pCtx->m_fNWScript == true) &&
             (nType_00 == NscType_Object && *(NscType *)((long)local_48 + 0xc) == NscType_Integer))
          {
            CNscPStackEntry::SetDataSize(pInit,0);
            CNscPStackEntry::PushConstantObject(pInit,0x7f000000);
          }
          else if (*(NscType *)((long)local_48 + 0xc) != nType_00) {
            CNscPStackEntry::SetType(this,NscType_Error);
            CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorParamDeclTypeMismatch,pId->m_pszId);
          }
        }
        else {
          CNscPStackEntry::SetType(this,NscType_Error);
          CNscContext::GenerateMessage
                    (g_pCtx,NscMessage_ErrorParamDefaultInitNotConstExp,pId->m_pszId);
        }
      }
      if (this->m_nType != NscType_Error) {
        CNscPStackEntry::SetType(this,nType_00);
        CNscPStackEntry::PushDeclaration(this,pId->m_pszId,nType_00,(uchar *)local_48,sVar2,-1,-1,0)
        ;
      }
    }
    CNwnDoubleLinkList::InsertAfter(&pType->m_link,&g_pCtx->m_listEntryFree);
    CNwnDoubleLinkList::InsertAfter(&pId->m_link,&g_pCtx->m_listEntryFree);
    if (pInit != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pInit->m_link,&g_pCtx->m_listEntryFree);
    }
    return this;
  }
  __assert_fail("pId",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                ,0x5f4,
                "CNscPStackEntry *NscBuildParameter(CNscPStackEntry *, CNscPStackEntry *, CNscPStackEntry *)"
               );
}

Assistant:

YYSTYPE NscBuildParameter (YYSTYPE pType, YYSTYPE pId, YYSTYPE pInit)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// Validate what we should have
	//

	assert (pType);
	assert (pId);

	//
	// Check for silent errors
	//

	if (pType ->GetType () == NscType_Error ||
		pId ->GetType () == NscType_Error ||
		(pInit != NULL && pInit ->GetType () == NscType_Error))
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we are ok
	//

	else if (g_pCtx ->IsPhase2 () || g_pCtx ->IsNWScript ())
	{

		NscType nType = pType ->GetType ();

		//
		// Check for constant type
		//

		if ((pType ->GetFlags () & NscSymFlag_Constant) != 0)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorConstIllegalOnParameter,
				pId ->GetIdentifier ());
		}

		//
		// If we have an initialization, the validate
		//

		size_t nInitSize = 0;
		unsigned char *pauchInit = NULL;

		//
		// If there is an initializer
		//

		if (pInit)
		{
			
			//
			// Get the initializer
			//

			nInitSize = pInit ->GetDataSize ();
			pauchInit = pInit ->GetData ();

			//
			// Simplify the constant on the parameter list
			// to check for unary minus values
			//

			NscSimplifyConstant (pauchInit, nInitSize);

			//
			// If not a simple value, then issue error
			//

			NscPCodeHeader *ph = (NscPCodeHeader *) pauchInit;
			if (ph ->nOpSize != nInitSize ||
				ph ->nOpCode != NscPCode_Constant)
			{
				pOut ->SetType (NscType_Error);
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorParamDefaultInitNotConstExp,
					pId ->GetIdentifier ());
			}

			//
			// If this is NWScript and we have object = int, then
			// adjust.
			//
			// NOTE: The NWScript prototype for SpeakOneLinerConversation
			//		uses a default value of OBJECT_TYPE_INVALID for and 
			//		object.  The problem is OBJECT_TYPE_INVALID is WRONG and
			//		really should be OBJECT_INVALID.
			//

			else if (g_pCtx ->IsNWScript () && 
				ph ->nType == NscType_Integer &&
				nType == NscType_Object)
			{
				pInit ->SetDataSize (0);
				pInit ->PushConstantObject (0x7F000000);
			}

			//
			// Validate that we have a matching type
			//

			else if (ph ->nType != nType)
			{
				pOut ->SetType (NscType_Error);
				g_pCtx ->GenerateMessage (NscMessage_ErrorParamDeclTypeMismatch,
					pId ->GetIdentifier ());
			}
		}

		//
		// If we didn't generate an error
		//

		if (pOut ->GetType () != NscType_Error)
		{
			pOut ->SetType (nType);
			pOut ->PushDeclaration (pId ->GetIdentifier (),
				nType, pauchInit, nInitSize, -1, -1, 0);
		}
	}

	//
	// Rundown
	//

	g_pCtx ->FreePStackEntry (pType);
    g_pCtx ->FreePStackEntry (pId);
	if (pInit)
         g_pCtx ->FreePStackEntry (pInit);

	//
	// Return results
	//

	return pOut;
}